

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgroupbox.cpp
# Opt level: O2

void QGroupBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *title;
  undefined8 *puVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  undefined1 uVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      uVar6 = *_a[1];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_003e052a:
        clicked((QGroupBox *)_o,(bool)uVar6);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        uVar6 = false;
        goto LAB_003e052a;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        toggled((QGroupBox *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      uVar6 = *_a[1];
LAB_003e04e4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setChecked((QGroupBox *)_o,(bool)uVar6);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QGroupBoxPrivate::_q_setChildrenEnabled(*(QGroupBoxPrivate **)(_o + 8),*_a[1]);
        return;
      }
      break;
    default:
      goto switchD_003e02b2_caseD_3;
    }
    goto LAB_003e0562;
  case ReadProperty:
    if (4 < (uint)_id) break;
    puVar1 = (undefined8 *)*_a;
    switch(_id) {
    case 0:
      QGroupBox::title((QString *)&local_38,(QGroupBox *)_o);
      pDVar3 = (Data *)*puVar1;
      pcVar4 = (char16_t *)puVar1[1];
      *puVar1 = local_38.d;
      puVar1[1] = local_38.ptr;
      qVar2 = puVar1[2];
      puVar1[2] = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar4;
      local_38.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      break;
    case 1:
      *(undefined4 *)puVar1 = *(undefined4 *)(*(long *)(_o + 8) + 0x270);
      break;
    case 2:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x278);
      goto LAB_003e0510;
    case 3:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x279);
LAB_003e0510:
      *(undefined1 *)puVar1 = uVar6;
      break;
    case 4:
      if (*(char *)(*(long *)(_o + 8) + 0x279) == '\x01') {
        uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x27a);
      }
      else {
        uVar6 = 0;
      }
      *(undefined1 *)puVar1 = uVar6;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      title = (QString *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTitle((QGroupBox *)_o,title);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setAlignment((QGroupBox *)_o,*(int *)&(title->d).d);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFlat((QGroupBox *)_o,*(bool *)&(title->d).d);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setCheckable((QGroupBox *)_o,*(bool *)&(title->d).d);
          return;
        }
        break;
      case 4:
        uVar6 = *(undefined1 *)&(title->d).d;
        goto LAB_003e04e4;
      }
      goto LAB_003e0562;
    }
    break;
  case IndexOfMethod:
    bVar5 = QtMocHelpers::indexOfMethod<void(QGroupBox::*)(bool)>
                      ((QtMocHelpers *)_a,(void **)clicked,0,0);
    if (!bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QGroupBox::*)(bool)>
                  ((QtMocHelpers *)_a,(void **)toggled,0,2);
        return;
      }
      goto LAB_003e0562;
    }
  }
switchD_003e02b2_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003e0562:
  __stack_chk_fail();
}

Assistant:

void QGroupBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGroupBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->clicked(); break;
        case 2: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->setChecked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->d_func()->_q_setChildrenEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGroupBox::*)(bool )>(_a, &QGroupBox::clicked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGroupBox::*)(bool )>(_a, &QGroupBox::toggled, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 1: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isFlat(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isCheckable(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isChecked(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 2: _t->setFlat(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setCheckable(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setChecked(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}